

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile(void)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t sVar2;
  size_t extraout_RDX_06;
  String *in_RDI;
  String SVar3;
  FilePath result;
  FilePath output_name;
  FilePath local_58;
  String local_48;
  String local_38;
  FilePath local_28;
  
  if (FLAGS_gtest_output == (char *)0x0) {
    pcVar1 = (char *)operator_new__(1);
    *pcVar1 = '\0';
    in_RDI->c_str_ = pcVar1;
    in_RDI->length_ = 0;
    sVar2 = extraout_RDX_01;
  }
  else {
    pcVar1 = strchr(FLAGS_gtest_output,0x3a);
    if (pcVar1 == (char *)0x0) {
      UnitTest::GetInstance();
      FilePath::FilePath((FilePath *)&local_48,
                         ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                         c_str_);
      FilePath::FilePath(&local_58,"test_detail.xml");
      FilePath::ConcatPaths((FilePath *)&local_38,(FilePath *)&local_48,&local_58);
      in_RDI->c_str_ = (char *)0x0;
      in_RDI->length_ = 0;
      String::operator=(in_RDI,&local_38);
      sVar2 = extraout_RDX_03;
      if (local_38.c_str_ != (char *)0x0) {
        operator_delete__(local_38.c_str_);
        sVar2 = extraout_RDX_04;
      }
      local_38.c_str_ = local_48.c_str_;
      if (local_58.pathname_.c_str_ != (char *)0x0) {
        operator_delete__(local_58.pathname_.c_str_);
        sVar2 = extraout_RDX_05;
        local_38.c_str_ = local_48.c_str_;
      }
    }
    else {
      FilePath::FilePath((FilePath *)&local_38,pcVar1 + 1);
      if (*local_38.c_str_ != '/') {
        UnitTest::GetInstance();
        FilePath::FilePath(&local_58,
                           ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).
                           pathname_.c_str_);
        FilePath::FilePath(&local_28,pcVar1 + 1);
        FilePath::ConcatPaths((FilePath *)&local_48,&local_58,&local_28);
        String::operator=(&local_38,&local_48);
        if (local_48.c_str_ != (char *)0x0) {
          operator_delete__(local_48.c_str_);
        }
        if (local_28.pathname_.c_str_ != (char *)0x0) {
          operator_delete__(local_28.pathname_.c_str_);
        }
        if (local_58.pathname_.c_str_ != (char *)0x0) {
          operator_delete__(local_58.pathname_.c_str_);
        }
      }
      if ((local_38.c_str_ == (char *)0x0 || local_38.length_ != 0) &&
         (local_38.c_str_[local_38.length_ - 1] == '/')) {
        GetCurrentExecutableName();
        GetOutputFormat();
        FilePath::GenerateUniqueFileName
                  ((FilePath *)&local_48,(FilePath *)&local_38,&local_58,local_28.pathname_.c_str_);
        if (local_28.pathname_.c_str_ != (char *)0x0) {
          operator_delete__(local_28.pathname_.c_str_);
        }
        if (local_58.pathname_.c_str_ != (char *)0x0) {
          operator_delete__(local_58.pathname_.c_str_);
        }
        in_RDI->c_str_ = (char *)0x0;
        in_RDI->length_ = 0;
        String::operator=(in_RDI,&local_48);
        sVar2 = extraout_RDX;
        if (local_48.c_str_ != (char *)0x0) {
          operator_delete__(local_48.c_str_);
          sVar2 = extraout_RDX_00;
        }
      }
      else {
        in_RDI->c_str_ = (char *)0x0;
        in_RDI->length_ = 0;
        String::operator=(in_RDI,&local_38);
        sVar2 = extraout_RDX_02;
      }
    }
    if (local_38.c_str_ != (char *)0x0) {
      operator_delete__(local_38.c_str_);
      sVar2 = extraout_RDX_06;
    }
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)in_RDI;
  return SVar3;
}

Assistant:

String UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return String("");

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return String(internal::FilePath::ConcatPaths(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile)).ToString() );

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.ToString();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.ToString();
}